

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

void fs_file_open_append(int add_flags)

{
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  char *pcVar4;
  uv_buf_t uVar5;
  
  unlink("test_file");
  loop = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_fs_open(0,&open_req1,"test_file",0x41,0x180,0);
  uVar5.len = iov.len;
  uVar5.base = iov.base;
  if (iVar1 < 0) {
    pcVar4 = "r >= 0";
    uVar3 = 0xac0;
  }
  else if (open_req1.result._4_4_ < 0) {
    pcVar4 = "open_req1.result >= 0";
    uVar3 = 0xac1;
    iov = uVar5;
  }
  else {
    uv_fs_req_cleanup(&open_req1);
    iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
    iVar1 = uv_fs_write(0,&write_req,(undefined4)open_req1.result,&iov,1,0xffffffffffffffff,0);
    if (iVar1 < 0) {
      pcVar4 = "r >= 0";
      uVar3 = 0xac6;
    }
    else if (write_req.result < 0) {
      pcVar4 = "write_req.result >= 0";
      uVar3 = 0xac7;
    }
    else {
      uv_fs_req_cleanup(&write_req);
      iVar1 = uv_fs_close(0,&close_req,(undefined4)open_req1.result,0);
      if (iVar1 == 0) {
        if (close_req.result == 0) {
          uv_fs_req_cleanup(&close_req);
          iVar1 = uv_fs_open(0,&open_req1,"test_file",0x402,0,0);
          if (iVar1 < 0) {
            pcVar4 = "r >= 0";
            uVar3 = 0xad1;
          }
          else if (open_req1.result._4_4_ < 0) {
            pcVar4 = "open_req1.result >= 0";
            uVar3 = 0xad2;
          }
          else {
            uv_fs_req_cleanup(&open_req1);
            uVar5 = (uv_buf_t)uv_buf_init(test_buf,0xd);
            iov = uVar5;
            iVar1 = uv_fs_write(0,&write_req,(undefined4)open_req1.result,&iov,1,0xffffffffffffffff,
                                0);
            if (iVar1 < 0) {
              pcVar4 = "r >= 0";
              uVar3 = 0xad7;
            }
            else if (write_req.result < 0) {
              pcVar4 = "write_req.result >= 0";
              uVar3 = 0xad8;
            }
            else {
              uv_fs_req_cleanup(&write_req);
              iVar1 = uv_fs_close(0,&close_req,(undefined4)open_req1.result,0);
              if (iVar1 == 0) {
                if (close_req.result == 0) {
                  uv_fs_req_cleanup(&close_req);
                  iVar1 = uv_fs_open(0,&open_req1,"test_file",0,0x100,0);
                  if (iVar1 < 0) {
                    pcVar4 = "r >= 0";
                    uVar3 = 0xae2;
                  }
                  else if (open_req1.result._4_4_ < 0) {
                    pcVar4 = "open_req1.result >= 0";
                    uVar3 = 0xae3;
                  }
                  else {
                    uv_fs_req_cleanup(&open_req1);
                    uVar5 = (uv_buf_t)uv_buf_init(buf,0x20);
                    iov = uVar5;
                    uVar2 = uv_fs_read(0,&read_req,(undefined4)open_req1.result,&iov,1,
                                       0xffffffffffffffff,0);
                    printf("read = %d\n",(ulong)uVar2);
                    if (uVar2 == 0x1a) {
                      if (read_req.result == 0x1a) {
                        iVar1 = bcmp(buf,"test-buffer\n",0x1a);
                        if (iVar1 == 0) {
                          uv_fs_req_cleanup(&read_req);
                          iVar1 = uv_fs_close(0,&close_req,(undefined4)open_req1.result,0);
                          if (iVar1 == 0) {
                            if (close_req.result == 0) {
                              uv_fs_req_cleanup(&close_req);
                              unlink("test_file");
                              return;
                            }
                            pcVar4 = "close_req.result == 0";
                            uVar3 = 0xaf2;
                          }
                          else {
                            pcVar4 = "r == 0";
                            uVar3 = 0xaf1;
                          }
                        }
                        else {
                          pcVar4 = 
                          "memcmp(buf, \"test-buffer\\n\\0test-buffer\\n\\0\", sizeof(\"test-buffer\\n\\0test-buffer\\n\\0\") - 1) == 0"
                          ;
                          uVar3 = 0xaed;
                        }
                      }
                      else {
                        pcVar4 = "read_req.result == 26";
                        uVar3 = 0xaea;
                      }
                    }
                    else {
                      pcVar4 = "r == 26";
                      uVar3 = 0xae9;
                    }
                  }
                }
                else {
                  pcVar4 = "close_req.result == 0";
                  uVar3 = 0xadd;
                }
              }
              else {
                pcVar4 = "r == 0";
                uVar3 = 0xadc;
              }
            }
          }
        }
        else {
          pcVar4 = "close_req.result == 0";
          uVar3 = 0xacc;
        }
      }
      else {
        pcVar4 = "r == 0";
        uVar3 = 0xacb;
      }
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

static void fs_file_open_append(int add_flags) {
  int r;

  /* Setup. */
  unlink("test_file");

  loop = uv_default_loop();

  r = uv_fs_open(NULL, &open_req1, "test_file",
      O_WRONLY | O_CREAT | add_flags, S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  iov = uv_buf_init(test_buf, sizeof(test_buf));
  r = uv_fs_write(NULL, &write_req, open_req1.result, &iov, 1, -1, NULL);
  ASSERT(r >= 0);
  ASSERT(write_req.result >= 0);
  uv_fs_req_cleanup(&write_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_open(NULL, &open_req1, "test_file",
      O_RDWR | O_APPEND | add_flags, 0, NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  iov = uv_buf_init(test_buf, sizeof(test_buf));
  r = uv_fs_write(NULL, &write_req, open_req1.result, &iov, 1, -1, NULL);
  ASSERT(r >= 0);
  ASSERT(write_req.result >= 0);
  uv_fs_req_cleanup(&write_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  r = uv_fs_open(NULL, &open_req1, "test_file", O_RDONLY | add_flags,
      S_IRUSR, NULL);
  ASSERT(r >= 0);
  ASSERT(open_req1.result >= 0);
  uv_fs_req_cleanup(&open_req1);

  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL, &read_req, open_req1.result, &iov, 1, -1, NULL);
  printf("read = %d\n", r);
  ASSERT(r == 26);
  ASSERT(read_req.result == 26);
  ASSERT(memcmp(buf,
                "test-buffer\n\0test-buffer\n\0",
                sizeof("test-buffer\n\0test-buffer\n\0") - 1) == 0);
  uv_fs_req_cleanup(&read_req);

  r = uv_fs_close(NULL, &close_req, open_req1.result, NULL);
  ASSERT(r == 0);
  ASSERT(close_req.result == 0);
  uv_fs_req_cleanup(&close_req);

  /* Cleanup */
  unlink("test_file");
}